

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w_wad.cpp
# Opt level: O1

int __thiscall FWadCollection::GetLastLump(FWadCollection *this,int wadnum)

{
  FResourceFile *pFVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((uint)wadnum < (this->Files).Count) {
    pFVar1 = (this->Files).Array[wadnum];
    iVar2 = pFVar1->FirstLump + pFVar1->NumLumps + -1;
  }
  return iVar2;
}

Assistant:

int FWadCollection::GetLastLump (int wadnum) const
{
	if ((DWORD)wadnum >= Files.Size())
	{
		return 0;
	}

	return Files[wadnum]->GetFirstLump() + Files[wadnum]->LumpCount() - 1;
}